

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_comparator.cc
# Opt level: O0

void __thiscall
google::protobuf::util::SimpleFieldComparator::SimpleFieldComparator(SimpleFieldComparator *this)

{
  SimpleFieldComparator *this_local;
  
  FieldComparator::FieldComparator(&this->super_FieldComparator);
  (this->super_FieldComparator)._vptr_FieldComparator =
       (_func_int **)&PTR__SimpleFieldComparator_02a49d20;
  this->float_comparison_ = EXACT;
  this->treat_nan_as_equal_ = false;
  this->has_default_tolerance_ = false;
  Tolerance::Tolerance(&this->default_tolerance_);
  absl::lts_20250127::
  flat_hash_map<const_google::protobuf::FieldDescriptor_*,_google::protobuf::util::SimpleFieldComparator::Tolerance,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_google::protobuf::util::SimpleFieldComparator::Tolerance>_>_>
  ::flat_hash_map(&this->map_tolerance_);
  return;
}

Assistant:

SimpleFieldComparator::SimpleFieldComparator()
    : float_comparison_(EXACT),
      treat_nan_as_equal_(false),
      has_default_tolerance_(false) {}